

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O3

wchar_t e_cmp_tval(void *a,void *b)

{
  wchar_t wVar1;
  
  wVar1 = default_join[*a].gid - default_join[*b].gid;
  if (wVar1 != L'\0') {
    return wVar1;
  }
  wVar1 = strcmp(e_info[default_join[*a].oid].name,e_info[default_join[*b].oid].name);
  return wVar1;
}

Assistant:

static int e_cmp_tval(const void *a, const void *b)
{
	const int a_val = *(const int *)a;
	const int b_val = *(const int *)b;
	const struct ego_item *ea = &e_info[default_item_id(a_val)];
	const struct ego_item *eb = &e_info[default_item_id(b_val)];

	/* Group by */
	int c = default_group_id(a_val) - default_group_id(b_val);
	if (c) return c;

	/* Order by */
	return strcmp(ea->name, eb->name);
}